

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::
set_activity_observer(i8255PortHandler *this,Observer *observer)

{
  Observer *pOVar1;
  bool bVar2;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  Observer *local_18;
  Observer *observer_local;
  i8255PortHandler *this_local;
  
  this->activity_observer_ = observer;
  if (this->activity_observer_ != (Observer *)0x0) {
    pOVar1 = this->activity_observer_;
    local_18 = observer;
    observer_local = (Observer *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"Tape motor",&local_39);
    (*pOVar1->_vptr_Observer[2])(pOVar1,local_38,0);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    pOVar1 = this->activity_observer_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"Tape motor",&local_71);
    bVar2 = Storage::Tape::BinaryTapePlayer::get_motor_control(this->tape_player_);
    (*pOVar1->_vptr_Observer[4])(pOVar1,local_70,(ulong)bVar2);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

void set_activity_observer(Activity::Observer *observer) {
					activity_observer_ = observer;
					if(activity_observer_) {
						activity_observer_->register_led("Tape motor");
						activity_observer_->set_led_status("Tape motor", tape_player_.get_motor_control());
					}
				}